

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O1

date_t duckdb::TimeBucket::OffsetTernaryOperator::
       Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>
                 (interval_t bucket_width,date_t ts,interval_t offset)

{
  interval_t bucket_width_00;
  BucketWidthType BVar1;
  date_t dVar2;
  NotImplementedException *this;
  undefined8 unaff_RBX;
  int64_t unaff_R12;
  string local_48;
  
  bucket_width_00.micros = unaff_R12;
  bucket_width_00._0_8_ = unaff_RBX;
  BVar1 = ClassifyBucketWidthErrorThrow(bucket_width_00);
  if (BVar1 == CONVERTIBLE_TO_MONTHS) {
    dVar2 = OffsetWidthConvertibleToMonthsTernaryOperator::
            Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>
                      (bucket_width,ts,offset);
    return (date_t)dVar2.days;
  }
  if (BVar1 == CONVERTIBLE_TO_MICROS) {
    dVar2 = OffsetWidthConvertibleToMicrosTernaryOperator::
            Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>
                      (bucket_width,ts,offset);
    return (date_t)dVar2.days;
  }
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Bucket type not implemented for TIME_BUCKET","");
  NotImplementedException::NotImplementedException(this,&local_48);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC offset) {
			BucketWidthType bucket_width_type = ClassifyBucketWidthErrorThrow(bucket_width);
			switch (bucket_width_type) {
			case BucketWidthType::CONVERTIBLE_TO_MICROS:
				return OffsetWidthConvertibleToMicrosTernaryOperator::Operation<TA, TB, TC, TR>(bucket_width, ts,
				                                                                                offset);
			case BucketWidthType::CONVERTIBLE_TO_MONTHS:
				return OffsetWidthConvertibleToMonthsTernaryOperator::Operation<TA, TB, TC, TR>(bucket_width, ts,
				                                                                                offset);
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}